

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O1

int ffgcrd(fitsfile *fptr,char *name,char *card,int *status)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  size_t sVar6;
  __int32_t **pp_Var7;
  char *pcVar8;
  undefined4 extraout_var;
  char cVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  char *pcVar13;
  char *pcVar14;
  uint uVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  int match;
  int cardlen;
  int nextkey;
  int exact;
  int nkeys;
  char keyname [75];
  char cardname [75];
  uint local_114;
  int local_fc;
  uint local_f8;
  int local_f4;
  ulong local_f0;
  ulong local_e8;
  int local_e0;
  undefined4 local_dc;
  char local_d8;
  undefined7 uStack_d7;
  char local_d0 [72];
  char local_88 [88];
  
  if (0 < *status) {
    return *status;
  }
  local_d8 = '\0';
  pcVar13 = name + -1;
  do {
    pcVar14 = pcVar13 + 1;
    pcVar13 = pcVar13 + 1;
  } while (*pcVar14 == ' ');
  pcVar14 = &local_d8;
  strncat(pcVar14,pcVar13,0x4a);
  sVar6 = strlen(pcVar14);
  uVar15 = (uint)sVar6;
  uVar10 = sVar6 & 0xffffffff;
  uVar11 = (ulong)(uVar15 + 1);
  do {
    if ((int)uVar10 < 1) {
      uVar11 = (ulong)((int)uVar15 >> 0x1f & uVar15);
      break;
    }
    uVar11 = (ulong)((int)uVar11 - 1);
    lVar17 = uVar10 + 3;
    uVar10 = uVar10 - 1;
  } while (*(char *)((long)&local_dc + lVar17) == ' ');
  uVar15 = (uint)uVar11;
  (&local_d8)[(int)uVar15] = '\0';
  if (0 < (int)uVar15) {
    pp_Var7 = __ctype_toupper_loc();
    uVar10 = 0;
    do {
      (&local_d8)[uVar10] = (char)(*pp_Var7)[(&local_d8)[uVar10]];
      uVar10 = uVar10 + 1;
    } while (uVar11 != uVar10);
  }
  if ((local_d8 == 'H') && (CONCAT71(uStack_d7,0x48) == 0x4843524152454948)) {
    if (uVar15 != 8) {
      pcVar13 = local_d0;
      do {
        pcVar8 = pcVar13;
        pcVar13 = pcVar8 + 1;
      } while (*pcVar8 == ' ');
      cVar9 = *pcVar8;
      lVar17 = 0;
      if (cVar9 != '\0') {
        do {
          lVar16 = lVar17;
          (&local_d8)[lVar16] = cVar9;
          cVar9 = (pcVar8 + 1)[lVar16];
          lVar17 = lVar16 + 1;
        } while (cVar9 != '\0');
        pcVar14 = local_d0 + lVar16 + -7;
      }
      uVar15 = (uint)lVar17;
      *pcVar14 = '\0';
      goto LAB_001b1b76;
    }
    uVar15 = 8;
    bVar2 = false;
  }
  else {
LAB_001b1b76:
    bVar2 = true;
  }
  if ((int)uVar15 < 9) {
    pcVar13 = strchr(&local_d8,0x3f);
    bVar3 = true;
    bVar1 = true;
    if (pcVar13 == (char *)0x0) {
      pcVar13 = strchr(&local_d8,0x2a);
      if (pcVar13 == (char *)0x0) {
        pcVar13 = strchr(&local_d8,0x23);
        bVar1 = true;
        if (pcVar13 == (char *)0x0) goto LAB_001b1be7;
      }
      else {
        bVar1 = false;
      }
    }
    local_114 = uVar15 - 2;
    if (bVar1) {
      local_114 = uVar15;
    }
    bVar1 = false;
  }
  else {
LAB_001b1be7:
    bVar1 = true;
    bVar3 = false;
    local_114 = uVar15;
  }
  ffghps(fptr,&local_dc,&local_f4,status);
  uVar4 = 2;
  if (2 < (int)uVar15) {
    uVar4 = uVar15;
  }
  local_e8 = (ulong)(uVar4 - 1);
  iVar12 = (local_dc - local_f4) + 1;
  local_f0 = 0;
  do {
    if (0 < iVar12) {
      iVar18 = 0;
      do {
        ffgnky(fptr,card,status);
        if (bVar2) {
          ffgknm(card,local_88,(int *)&local_f8,status);
          uVar4 = local_f8;
          uVar10 = (ulong)local_f8;
          if (!(bool)(local_f8 != uVar15 & bVar1) && (int)local_114 <= (int)local_f8) {
            if (0 < (int)local_f8) {
              uVar11 = 0;
              do {
                cVar9 = local_88[uVar11];
                if (0x60 < (long)cVar9) {
                  pp_Var7 = __ctype_toupper_loc();
                  local_88[uVar11] = (char)(*pp_Var7)[cVar9];
                }
                uVar11 = uVar11 + 1;
              } while (uVar10 != uVar11);
            }
            if (bVar1) {
              if ((&local_d8)[local_e8] == local_88[local_e8]) {
                if (local_d8 == local_88[0]) {
                  pcVar13 = &local_d8;
                  uVar10 = local_e8;
                  pcVar14 = local_88;
                  goto LAB_001b1d33;
                }
              }
              else if (uVar4 == 0 && uVar15 == 0) goto LAB_001b1dc4;
            }
            else {
              ffcmps(&local_d8,local_88,1,&local_fc,&local_e0);
              if (local_fc != 0) goto LAB_001b1dc4;
            }
          }
        }
        else if (*card == 'H') {
          uVar10 = 8;
          pcVar13 = "HIERARCH";
          pcVar14 = card;
LAB_001b1d33:
          iVar5 = strncmp(pcVar13,pcVar14,uVar10);
          if (iVar5 == 0) {
LAB_001b1dc4:
            return *status;
          }
        }
        iVar18 = iVar18 + 1;
      } while (iVar18 != iVar12);
    }
    if ((local_f0 & 1) != 0 || bVar3) {
      *status = 0xca;
      return 0xca;
    }
    iVar18 = ffmaky(fptr,1,status);
    iVar12 = local_f4 + -1;
    local_f0 = CONCAT71((int7)(CONCAT44(extraout_var,iVar18) >> 8),1);
  } while( true );
}

Assistant:

int ffgcrd( fitsfile *fptr,     /* I - FITS file pointer        */
            const char *name,         /* I - name of keyword to read  */
            char *card,         /* O - keyword card             */
            int  *status)       /* IO - error status            */
/*
  Read (get) the named keyword, returning the entire keyword card up to
  80 characters long.  
  The returned card value is null terminated with any trailing blank 
  characters removed.

  If the input name contains wild cards ('?' matches any single char
  and '*' matches any sequence of chars, # matches any string of decimal
  digits) then the search ends once the end of header is reached and does 
  not automatically resume from the top of the header.
*/
{
    int nkeys, nextkey, ntodo, namelen, namelen_limit, namelenminus1, cardlen;
    int ii = 0, jj, kk, wild, match, exact, hier = 0;
    char keyname[FLEN_KEYWORD], cardname[FLEN_KEYWORD];
    char *ptr1, *ptr2, *gotstar;

    if (*status > 0)
        return(*status);

    *keyname = '\0';
    
    while (name[ii] == ' ')  /* skip leading blanks in name */
        ii++;

    strncat(keyname, &name[ii], FLEN_KEYWORD - 1);

    namelen = strlen(keyname);

    while (namelen > 0 && keyname[namelen - 1] == ' ')
         namelen--;            /* ignore trailing blanks in name */

    keyname[namelen] = '\0';  /* terminate the name */

    for (ii=0; ii < namelen; ii++)       
        keyname[ii] = toupper(keyname[ii]);    /*  make upper case  */

    if (FSTRNCMP("HIERARCH", keyname, 8) == 0)
    {
        if (namelen == 8)
        {
            /* special case: just looking for any HIERARCH keyword */
            hier = 1;
        }
        else
        {
            /* ignore the leading HIERARCH and look for the 'real' name */
            /* starting with first non-blank character following HIERARCH */
            ptr1 = keyname;
            ptr2 = &keyname[8];

            while(*ptr2 == ' ')
                ptr2++;

            namelen = 0;
            while(*ptr2)
            {
                *ptr1 = *ptr2;
                 ptr1++;
                 ptr2++;
                 namelen++;
            }
            *ptr1 = '\0';
        }
    }

    /* does input name contain wild card chars?  ('?',  '*', or '#') */
    /* wild cards are currently not supported with HIERARCH keywords */

    namelen_limit = namelen;
    gotstar = 0;
    if (namelen < 9 && 
       (strchr(keyname,'?') || (gotstar = strchr(keyname,'*')) || 
        strchr(keyname,'#')) )
    {
        wild = 1;

        /* if we found a '*' wild card in the name, there might be */
        /* more than one.  Support up to 2 '*' in the template. */
        /* Thus we need to compare keywords whose names have at least */
        /* namelen - 2 characters.                                   */
        if (gotstar)
           namelen_limit -= 2;           
    }
    else
        wild = 0;

    ffghps(fptr, &nkeys, &nextkey, status); /* get no. keywords and position */

    namelenminus1 = maxvalue(namelen - 1, 1);
    ntodo = nkeys - nextkey + 1;  /* first, read from next keyword to end */
    for (jj=0; jj < 2; jj++)
    {
      for (kk = 0; kk < ntodo; kk++)
      {
        ffgnky(fptr, card, status);     /* get next keyword */

        if (hier)
        {
           if (FSTRNCMP("HIERARCH", card, 8) == 0)
                return(*status);  /* found a HIERARCH keyword */
        }
        else
        {
          ffgknm(card, cardname, &cardlen, status); /* get the keyword name */

          if (cardlen >= namelen_limit)  /* can't match if card < name */
          { 
            /* if there are no wild cards, lengths must be the same */
            if (!( !wild && cardlen != namelen) )
            {
              for (ii=0; ii < cardlen; ii++)
              {    
                /* make sure keyword is in uppercase */
                if (cardname[ii] > 96)
                {
                  /* This assumes the ASCII character set in which */
                  /* upper case characters start at ASCII(97)  */
                  /* Timing tests showed that this is 20% faster */
                  /* than calling the isupper function.          */

                  cardname[ii] = toupper(cardname[ii]);  /* make upper case */
                }
              }

              if (wild)
              {
                ffcmps(keyname, cardname, 1, &match, &exact);
                if (match)
                    return(*status); /* found a matching keyword */
              }
              else if (keyname[namelenminus1] == cardname[namelenminus1])
              {
                /* test the last character of the keyword name first, on */
                /* the theory that it is less likely to match then the first */
                /* character since many keywords begin with 'T', for example */

                if (FSTRNCMP(keyname, cardname, namelenminus1) == 0)
                {
                  return(*status);   /* found the matching keyword */
                }
              }
	      else if (namelen == 0 && cardlen == 0)
	      {
	         /* matched a blank keyword */
		 return(*status);
	      }
            }
          }
        }
      }

      if (wild || jj == 1)
            break;  /* stop at end of header if template contains wildcards */

      ffmaky(fptr, 1, status);  /* reset pointer to beginning of header */
      ntodo = nextkey - 1;      /* number of keyword to read */ 
    }

    return(*status = KEY_NO_EXIST);  /* couldn't find the keyword */
}